

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::AdamOptimizer::AdamOptimizer(AdamOptimizer *this,AdamOptimizer *from)

{
  bool bVar1;
  Int64Parameter *this_00;
  DoubleParameter *pDVar2;
  AdamOptimizer *from_local;
  AdamOptimizer *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__AdamOptimizer_006f8618;
  google::protobuf::internal::CachedSize::CachedSize(&this->_cached_size_);
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  bVar1 = _internal_has_learningrate(from);
  if (bVar1) {
    pDVar2 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar2,from->learningrate_);
    this->learningrate_ = pDVar2;
  }
  else {
    this->learningrate_ = (DoubleParameter *)0x0;
  }
  bVar1 = _internal_has_minibatchsize(from);
  if (bVar1) {
    this_00 = (Int64Parameter *)operator_new(0x28);
    Int64Parameter::Int64Parameter(this_00,from->minibatchsize_);
    this->minibatchsize_ = this_00;
  }
  else {
    this->minibatchsize_ = (Int64Parameter *)0x0;
  }
  bVar1 = _internal_has_beta1(from);
  if (bVar1) {
    pDVar2 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar2,from->beta1_);
    this->beta1_ = pDVar2;
  }
  else {
    this->beta1_ = (DoubleParameter *)0x0;
  }
  bVar1 = _internal_has_beta2(from);
  if (bVar1) {
    pDVar2 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar2,from->beta2_);
    this->beta2_ = pDVar2;
  }
  else {
    this->beta2_ = (DoubleParameter *)0x0;
  }
  bVar1 = _internal_has_eps(from);
  if (bVar1) {
    pDVar2 = (DoubleParameter *)operator_new(0x28);
    DoubleParameter::DoubleParameter(pDVar2,from->eps_);
    this->eps_ = pDVar2;
  }
  else {
    this->eps_ = (DoubleParameter *)0x0;
  }
  return;
}

Assistant:

AdamOptimizer::AdamOptimizer(const AdamOptimizer& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite() {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  if (from._internal_has_learningrate()) {
    learningrate_ = new ::CoreML::Specification::DoubleParameter(*from.learningrate_);
  } else {
    learningrate_ = nullptr;
  }
  if (from._internal_has_minibatchsize()) {
    minibatchsize_ = new ::CoreML::Specification::Int64Parameter(*from.minibatchsize_);
  } else {
    minibatchsize_ = nullptr;
  }
  if (from._internal_has_beta1()) {
    beta1_ = new ::CoreML::Specification::DoubleParameter(*from.beta1_);
  } else {
    beta1_ = nullptr;
  }
  if (from._internal_has_beta2()) {
    beta2_ = new ::CoreML::Specification::DoubleParameter(*from.beta2_);
  } else {
    beta2_ = nullptr;
  }
  if (from._internal_has_eps()) {
    eps_ = new ::CoreML::Specification::DoubleParameter(*from.eps_);
  } else {
    eps_ = nullptr;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.AdamOptimizer)
}